

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_AigerWriteLut(Gia_Man_t *p,char *pFileName)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 *__ptr;
  Vec_Wrd_t *vTruths;
  word *__s;
  word wVar9;
  FILE *__s_00;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  undefined4 *puVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  iVar6 = Gia_ManLutSizeMax(p);
  iVar18 = 1 << ((char)iVar6 - 5U & 0x1f);
  if (iVar6 < 6) {
    iVar18 = 1;
  }
  iVar8 = p->vCis->nSize;
  iVar16 = p->vCos->nSize;
  iVar7 = Gia_ManLutNum(p);
  iVar8 = iVar7 + iVar8 + iVar16 + 1;
  __ptr = (undefined4 *)calloc((long)iVar8,0x54);
  uVar14 = p->nObjs;
  uVar13 = (ulong)uVar14;
  vTruths = (Vec_Wrd_t *)malloc(0x10);
  uVar19 = 0x10;
  if (0xe < uVar14 - 1) {
    uVar19 = uVar14;
  }
  vTruths->nCap = uVar19;
  if (uVar19 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)(int)uVar19 << 3);
  }
  vTruths->pArray = __s;
  vTruths->nSize = uVar14;
  memset(__s,0,(long)(int)uVar14 << 3);
  if (6 < iVar6) {
    __assert_fail("LutSizeMax <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x7e7,"void Gia_AigerWriteLut(Gia_Man_t *, char *)");
  }
  *__ptr = 3;
  sVar11 = (long)iVar18 << 2;
  memset(__ptr + 0xd,0xff,sVar11);
  auVar5 = _DAT_0093d220;
  pGVar2 = p->pObjs;
  if (0 < (int)uVar14) {
    lVar10 = uVar13 - 1;
    auVar20._8_4_ = (int)lVar10;
    auVar20._0_8_ = lVar10;
    auVar20._12_4_ = (int)((ulong)lVar10 >> 0x20);
    lVar10 = 0;
    auVar20 = auVar20 ^ _DAT_0093d220;
    auVar21 = _DAT_0093e4e0;
    auVar22 = _DAT_0093d210;
    do {
      auVar23 = auVar22 ^ auVar5;
      iVar18 = auVar20._4_4_;
      if ((bool)(~(auVar23._4_4_ == iVar18 && auVar20._0_4_ < auVar23._0_4_ ||
                  iVar18 < auVar23._4_4_) & 1)) {
        *(undefined4 *)((long)&pGVar2->Value + lVar10) = 0xffffffff;
      }
      if ((auVar23._12_4_ != auVar20._12_4_ || auVar23._8_4_ <= auVar20._8_4_) &&
          auVar23._12_4_ <= auVar20._12_4_) {
        *(undefined4 *)((long)&pGVar2[1].Value + lVar10) = 0xffffffff;
      }
      auVar23 = auVar21 ^ auVar5;
      iVar6 = auVar23._4_4_;
      if (iVar6 <= iVar18 && (iVar6 != iVar18 || auVar23._0_4_ <= auVar20._0_4_)) {
        *(undefined4 *)((long)&pGVar2[2].Value + lVar10) = 0xffffffff;
        *(undefined4 *)((long)&pGVar2[3].Value + lVar10) = 0xffffffff;
      }
      lVar17 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 4;
      auVar22._8_8_ = lVar17 + 4;
      lVar17 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 4;
      auVar21._8_8_ = lVar17 + 4;
      lVar10 = lVar10 + 0x30;
    } while ((ulong)(uVar14 + 3 >> 2) * 0x30 != lVar10);
  }
  __ptr[1] = 0;
  pGVar2->Value = 0;
  iVar18 = p->vCis->nSize;
  if ((long)iVar18 < 1) {
    iVar6 = 1;
  }
  else {
    piVar3 = p->vCis->pArray;
    iVar6 = iVar18 + 1;
    lVar10 = 0;
    puVar15 = __ptr;
    do {
      iVar16 = *(int *)((long)piVar3 + lVar10 * 2);
      if (((long)iVar16 < 0) || ((int)uVar14 <= iVar16)) goto LAB_00245b42;
      puVar15[0x15] = 1;
      memset(puVar15 + 0x22,0xaa,sVar11);
      lVar10 = lVar10 + 2;
      puVar15[0x16] = (uint)lVar10;
      pGVar2[iVar16].Value = (uint)lVar10;
      puVar15 = puVar15 + 0x15;
    } while ((long)iVar18 * 2 != lVar10);
  }
  if (0 < (int)uVar14) {
    lVar10 = 0;
    do {
      uVar14 = (uint)uVar13;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      if (lVar10 != 0) {
        uVar19 = p->vMapping->nSize;
        if ((int)uVar19 <= lVar10) {
LAB_00245b80:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar3 = p->vMapping->pArray;
        uVar1 = piVar3[lVar10];
        uVar12 = (ulong)uVar1;
        if (uVar12 != 0) {
          lVar17 = (long)iVar6;
          __ptr[lVar17 * 0x15] = 3;
          if (((int)uVar1 < 0) || (uVar19 <= uVar1)) goto LAB_00245b80;
          uVar19 = piVar3[uVar12];
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          else {
            uVar13 = 0;
            do {
              iVar18 = piVar3[uVar12 + uVar13 + 1];
              if (((long)iVar18 < 0) || ((int)uVar14 <= iVar18)) goto LAB_00245b42;
              __ptr[lVar17 * 0x15 + uVar13 + 5] = pGVar2[iVar18].Value;
              uVar13 = uVar13 + 1;
            } while (uVar19 != uVar13);
          }
          __ptr[lVar17 * 0x15 + 3] = uVar19;
          wVar9 = Gia_LutComputeTruth6(p,(int)lVar10,vTruths);
          *(word *)(__ptr + lVar17 * 0x15 + 0xd) = wVar9;
          if (iVar6 < 0) goto LAB_00245b61;
          __ptr[lVar17 * 0x15 + 1] = iVar6 * 2;
          pGVar2[lVar10].Value = iVar6 * 2;
          iVar6 = iVar6 + 1;
          uVar13 = (ulong)(uint)p->nObjs;
        }
      }
      lVar10 = lVar10 + 1;
      uVar14 = (uint)uVar13;
    } while (lVar10 < (int)uVar14);
  }
  iVar18 = p->vCos->nSize;
  if (0 < (long)iVar18) {
    piVar3 = p->vCos->pArray;
    uVar19 = iVar6 * 2;
    puVar15 = __ptr + (long)iVar6 * 0x15 + 0xd;
    lVar10 = 0;
    do {
      iVar16 = piVar3[lVar10];
      if (((long)iVar16 < 0) || ((int)uVar14 <= iVar16)) {
LAB_00245b42:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        iVar18 = (int)lVar10;
        break;
      }
      pGVar2 = p->pObjs + iVar16;
      puVar15[-0xd] = 2;
      uVar4 = *(undefined8 *)pGVar2;
      uVar13 = (ulong)((uint)uVar4 & 0x1fffffff);
      puVar15[-8] = pGVar2[-uVar13].Value;
      if ((((uint)uVar4 >> 0x1d & 1) == 0) ==
          ((~*(ulong *)(pGVar2 + -uVar13) & 0x1fffffff1fffffff) == 0)) {
        iVar16 = 0x55;
      }
      else {
        iVar16 = 0xaa;
      }
      memset(puVar15,iVar16,sVar11);
      puVar15[-10] = 1;
      if (iVar6 < 0) {
LAB_00245b61:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      puVar15[-0xc] = uVar19;
      pGVar2->Value = uVar19;
      lVar10 = lVar10 + 1;
      uVar19 = uVar19 + 2;
      puVar15 = puVar15 + 0x15;
    } while (iVar18 != lVar10);
    iVar6 = iVar18 + iVar6;
  }
  if (iVar6 != iVar8) {
    __assert_fail("iLut == nLuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x810,"void Gia_AigerWriteLut(Gia_Man_t *, char *)");
  }
  __s_00 = fopen(pFileName,"wb");
  if (__s_00 == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
  }
  else {
    uVar14 = iVar8 * 0x54;
    sVar11 = fwrite(__ptr,1,(long)(int)uVar14,__s_00);
    if (uVar14 != (uint)sVar11) {
      __assert_fail("nSize1 == nSize2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                    ,0x81a,"void Gia_AigerWriteLut(Gia_Man_t *, char *)");
    }
    printf("Successfully dumped %d bytes of binary data.\n",(ulong)uVar14);
  }
  fclose(__s_00);
  free(__ptr);
  if (vTruths->pArray != (word *)0x0) {
    free(vTruths->pArray);
  }
  free(vTruths);
  return;
}

Assistant:

void Gia_AigerWriteLut( Gia_Man_t * p, char * pFileName )
{
    Gia_Obj_t * pObj;
    int i, k, iFan, iLut = 0;
    int LutSizeMax = Gia_ManLutSizeMax( p );
    int nUints = Abc_TruthWordNum(LutSizeMax);
    int nLuts = 1 + Gia_ManCiNum(p) + Gia_ManCoNum(p) + Gia_ManLutNum(p);
    Gia_MapLut_t * pLuts = ABC_CALLOC( Gia_MapLut_t, nLuts );
    Vec_Wrd_t * vTruths = Vec_WrdStart( Gia_ManObjNum(p) );
    assert( LutSizeMax <= 6 );
    // set obj numbers
    // constant
    pLuts->Type = 3;
    memset( pLuts->pTruth, 0xFF, sizeof(unsigned) * nUints );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = pLuts[iLut].Out = Abc_Var2Lit( iLut, 0 );
    iLut++;
    // inputs
    Gia_ManForEachCi( p, pObj, i )
    {
        pLuts[iLut].Type = 1;
        memset( pLuts[iLut].pTruth, 0xAA, sizeof(unsigned) * nUints );
        pObj->Value = pLuts[iLut].Out = Abc_Var2Lit( iLut, 0 );
        iLut++;
    }
    // nodes
    Gia_ManForEachObj( p, pObj, i )
        if ( i && Gia_ObjIsLut(p, i) )
        {
            pLuts[iLut].Type = 3;
            Gia_LutForEachFanin( p, i, iFan, k )
                pLuts[iLut].pFans[k] = Gia_ManObj(p, iFan)->Value;
            pLuts[iLut].nFans = k;
            *(word *)pLuts[iLut].pTruth = Gia_LutComputeTruth6(p, i, vTruths);
            pObj->Value = pLuts[iLut].Out = Abc_Var2Lit( iLut, 0 );
            iLut++;
        }
    // outputs
    Gia_ManForEachCo( p, pObj, i )
    {
        pLuts[iLut].Type = 2;
        pLuts[iLut].pFans[0] = Gia_ObjFanin0(pObj)->Value;
        if ( Gia_ObjFaninC0(pObj) ^ Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
            memset( pLuts[iLut].pTruth, 0x55, sizeof(unsigned) * nUints );
        else
            memset( pLuts[iLut].pTruth, 0xAA, sizeof(unsigned) * nUints );
        pLuts[iLut].nFans = 1;
        pObj->Value = pLuts[iLut].Out = Abc_Var2Lit( iLut, 0 );
        iLut++;
    }
    assert( iLut == nLuts );
    // dump into a file
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            int nSize1 = nLuts * sizeof(Gia_MapLut_t);
            int nSize2 = fwrite( pLuts, 1, nSize1, pFile );
            assert( nSize1 == nSize2 );
            printf( "Successfully dumped %d bytes of binary data.\n", nSize1 );
        }
        fclose( pFile );
    }
    ABC_FREE( pLuts );
    Vec_WrdFree( vTruths );
}